

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

string * __thiscall
symbols::BoolObject::toString_abi_cxx11_(string *__return_storage_ptr__,BoolObject *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  cVar1 = (this->super_Object).field_0xc;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (cVar1 == '\x01') {
    pcVar3 = "true";
    pcVar2 = "";
  }
  else {
    pcVar3 = "false";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string BoolObject::toString() const
{
    if(value)
        return "true";
    return "false";

}